

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Im<(moira::Mode)11,_2> wrapper)

{
  ushort uVar1;
  Syntax SVar2;
  char *pcVar3;
  UInt u;
  
  pcVar3 = this->ptr;
  SVar2 = this->style->syntax;
  uVar1 = (ushort)(wrapper.ea)->ext1;
  this->ptr = pcVar3 + 1;
  *pcVar3 = '#';
  if ((SVar2 & ~MOIRA_MIT) == GNU) {
    operator<<(this,(Int)(int)(short)uVar1);
  }
  else {
    u.raw._2_2_ = 0;
    u.raw._0_2_ = uVar1;
    operator<<(this,u);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Im<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << Ims<S>(ea.ext1);
            break;

        default:

            *this << Imu<S>(ea.ext1);
            break;
    }

    return *this;
}